

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O0

Qiniu_Error Qiniu_Qetag_Reset(_Qiniu_Qetag_Context *ctx)

{
  Qiniu_Digest *pQVar1;
  Qiniu_Error QVar2;
  _Qiniu_Qetag_Context *ctx_local;
  Qiniu_Error err;
  
  pQVar1 = Qiniu_Digest_New(QINIU_DIGEST_TYPE_SHA1);
  ctx->sha1Digest = pQVar1;
  if (ctx->sha1Digest == (Qiniu_Digest *)0x0) {
    ctx_local = (_Qiniu_Qetag_Context *)0x270f;
    err._0_8_ = anon_var_dwarf_badd;
  }
  else {
    ctx->blkCount = 0;
    ctx->blkUnused = ctx->blkElementCount;
    ctx->blkBegin = 0;
    ctx->blkEnd = 0;
    ctx->blk = (Qiniu_Qetag_Block *)0x0;
    QVar2 = Qiniu_Qetag_allocateBlock(ctx,&ctx->blk);
    err._0_8_ = QVar2.message;
    ctx_local = (_Qiniu_Qetag_Context *)(ulong)(uint)QVar2.code;
    if (QVar2.code == 200) {
      ctx_local = (_Qiniu_Qetag_Context *)0xc8;
      err._0_8_ = anon_var_dwarf_bac7;
    }
  }
  QVar2.message = (char *)err._0_8_;
  QVar2._0_8_ = ctx_local;
  return QVar2;
}

Assistant:

Qiniu_Error Qiniu_Qetag_Reset(struct _Qiniu_Qetag_Context * ctx)
{
    Qiniu_Error err;

	ctx->sha1Digest = Qiniu_Digest_New(QINIU_DIGEST_TYPE_SHA1);
	if (ctx->sha1Digest == NULL) {
		err.code = 9999;
		err.message = "openssl internal error";
		return err;
	}

    ctx->blkCount   = 0;
    ctx->blkUnused  = ctx->blkElementCount;
    ctx->blkBegin   = 0;
    ctx->blkEnd     = 0;
    ctx->blk        = NULL;

    err = Qiniu_Qetag_allocateBlock(ctx, &ctx->blk);
    if (err.code != 200) {
        return err;
    }

    err.code = 200;
    err.message = "ok";
    return err;
}